

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_info.cpp
# Opt level: O2

string * __thiscall
duckdb::TransactionInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,TransactionInfo *this)

{
  char cVar1;
  InternalException *pIVar2;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_80);
  if (2 < (byte)((this->super_ParseInfo).field_0x9 - 1)) {
    pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_80,"ToString for TransactionStatement with type: %s not implemented"
               ,&local_81);
    EnumUtil::ToString<duckdb::TransactionType>(&local_40,(this->super_ParseInfo).field_0x9);
    InternalException::InternalException<std::__cxx11::string>(pIVar2,&local_80,&local_40);
    __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  cVar1 = (this->super_ParseInfo).field_0xa;
  if (cVar1 != '\0') {
    if ((cVar1 != '\x01') && (cVar1 != '\x02')) {
      pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_80,
                 "ToString for TransactionStatement with modifier type: %s not implemented",
                 &local_81);
      EnumUtil::ToString<duckdb::TransactionModifierType>
                (&local_60,(this->super_ParseInfo).field_0xa);
      InternalException::InternalException<std::__cxx11::string>(pIVar2,&local_80,&local_60);
      __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string TransactionInfo::ToString() const {
	string result = "";
	switch (type) {
	case TransactionType::BEGIN_TRANSACTION:
		result += "BEGIN";
		break;
	case TransactionType::COMMIT:
		result += "COMMIT";
		break;
	case TransactionType::ROLLBACK:
		result += "ROLLBACK";
		break;
	default: {
		throw InternalException("ToString for TransactionStatement with type: %s not implemented",
		                        EnumUtil::ToString(type));
	}
	}
	switch (modifier) {
	case TransactionModifierType::TRANSACTION_DEFAULT_MODIFIER:
		break;
	case TransactionModifierType::TRANSACTION_READ_ONLY:
		result += " READ ONLY";
		break;
	case TransactionModifierType::TRANSACTION_READ_WRITE:
		result += " READ WRITE";
		break;
	default:
		throw InternalException("ToString for TransactionStatement with modifier type: %s not implemented",
		                        EnumUtil::ToString(modifier));
	}
	result += ";";
	return result;
}